

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

size_t __thiscall google::protobuf::internal::ExtensionSet::MessageSetByteSize(ExtensionSet *this)

{
  uint16_t uVar1;
  size_t sVar2;
  KeyValue *pKVar3;
  KeyValue *pKVar4;
  size_t total_size;
  size_t local_18;
  
  local_18 = 0;
  uVar1 = this->flat_size_;
  pKVar3 = (this->map_).flat;
  if ((long)(short)uVar1 < 0) {
    ForEach<std::_Rb_tree_iterator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,google::protobuf::internal::ExtensionSet::MessageSetByteSize()const::__0>
              ((_Base_ptr)(pKVar3->second).descriptor,
               (_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                )&pKVar3->second,(anon_class_8_1_736c71da)&local_18);
  }
  else if (uVar1 != 0) {
    pKVar4 = pKVar3 + (short)uVar1;
    do {
      sVar2 = Extension::MessageSetItemByteSize(&pKVar3->second,pKVar3->first);
      local_18 = local_18 + sVar2;
      pKVar3 = pKVar3 + 1;
    } while (pKVar3 != pKVar4);
  }
  return local_18;
}

Assistant:

size_t ExtensionSet::MessageSetByteSize() const {
  size_t total_size = 0;
  ForEach([&total_size](int number, const Extension& ext) {
    total_size += ext.MessageSetItemByteSize(number);
  });
  return total_size;
}